

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler.cpp
# Opt level: O2

void __thiscall SerialTaskRunner::insert(SerialTaskRunner *this,function<void_()> func)

{
  function<void_()> *in_RSI;
  long in_FS_OFFSET;
  unique_lock<std::mutex> uStack_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)&uStack_28,&this->m_callbacks_mutex,
             "m_callbacks_mutex",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/scheduler.cpp"
             ,0xb3,false);
  std::__cxx11::list<std::function<void()>,std::allocator<std::function<void()>>>::
  emplace_back<std::function<void()>>
            ((list<std::function<void()>,std::allocator<std::function<void()>>> *)
             &this->m_callbacks_pending,in_RSI);
  std::unique_lock<std::mutex>::~unique_lock(&uStack_28);
  MaybeScheduleProcessQueue(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SerialTaskRunner::insert(std::function<void()> func)
{
    {
        LOCK(m_callbacks_mutex);
        m_callbacks_pending.emplace_back(std::move(func));
    }
    MaybeScheduleProcessQueue();
}